

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall Assimp::SMDImporter::CreateOutputMeshes(SMDImporter *this)

{
  aiFace *paVar1;
  aiMatrix4x4 *paVar2;
  aiScene *paVar3;
  pointer puVar4;
  pointer puVar5;
  aiBone *paVar6;
  Vertex *__n;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  uint iWeight;
  uint uVar20;
  pointer pbVar21;
  aiMesh **ppaVar22;
  ulong *puVar23;
  Logger *pLVar24;
  aiMesh *this_00;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  aiFace *paVar28;
  aiVector3D *paVar29;
  uint *puVar30;
  aiBone **ppaVar31;
  aiVertexWeight *__s;
  pointer pBVar32;
  pointer pbVar33;
  pointer pFVar34;
  uint uVar35;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar36;
  uint iVert;
  long lVar37;
  ulong uVar38;
  pointer pBVar39;
  long lVar40;
  uint i;
  value_type_conflict4 local_cc;
  ulong local_c8;
  aiBone *local_c0;
  ulong *local_b8;
  aiVector3D *local_b0;
  ulong *local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  ulong local_98;
  undefined1 local_90 [8];
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  ulong local_70;
  aiVector3D *local_68;
  aiVector3D *local_60;
  aiMesh **local_58;
  ulong *local_50;
  ulong *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  ulong local_38;
  
  pbVar33 = (this->aszTextures).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar21 = (this->aszTextures).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar33 == pbVar21) {
    local_90 = (undefined1  [8])&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->aszTextures,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    pbVar33 = (this->aszTextures).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar21 = (this->aszTextures).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  this->pScene->mNumMeshes = (uint)((ulong)((long)pbVar21 - (long)pbVar33) >> 5);
  paVar3 = this->pScene;
  ppaVar22 = (aiMesh **)operator_new__((ulong)paVar3->mNumMeshes << 3);
  paVar3->mMeshes = ppaVar22;
  paVar3 = this->pScene;
  uVar20 = paVar3->mNumMeshes;
  lVar37 = (ulong)uVar20 * 0x18;
  puVar23 = (ulong *)operator_new__(lVar37 + 8);
  *puVar23 = (ulong)uVar20;
  pvVar36 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(puVar23 + 1);
  if (uVar20 != 0) {
    uVar38 = lVar37 - 0x18;
    memset(pvVar36,0,(uVar38 - uVar38 % 0x18) + 0x18);
  }
  uVar27 = (ulong)paVar3->mNumMeshes;
  uVar38 = (((long)(this->asTriangles).
                   super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl
                   .super__Vector_impl_data._M_finish -
            (long)(this->asTriangles).
                  super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
                  super__Vector_impl_data._M_start) / 200 & 0xffffffffU) / uVar27;
  local_cc = (int)(uVar38 >> 1) + (int)uVar38;
  local_a0 = pvVar36;
  for (uVar38 = 0; uVar38 < uVar27; uVar38 = uVar38 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(pvVar36,(ulong)local_cc);
    uVar27 = (ulong)this->pScene->mNumMeshes;
    pvVar36 = pvVar36 + 1;
  }
  local_cc = 0;
  pFVar34 = (this->asTriangles).
            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_50 = puVar23;
  do {
    if (pFVar34 ==
        (this->asTriangles).
        super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar38 = 0;
      while( true ) {
        puVar23 = local_50;
        pvVar36 = local_a0;
        if (this->pScene->mNumMeshes <= (uint)uVar38) {
          lVar40 = *local_50 * 0x18;
          lVar37 = lVar40;
          uVar38 = *local_50;
          while (uVar38 != 0) {
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                       ((long)puVar23 + lVar37 + -0x10));
            lVar37 = lVar37 + -0x18;
            uVar38 = lVar37;
          }
          operator_delete__(puVar23,lVar40 + 8);
          return;
        }
        local_70 = uVar38;
        this_00 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(this_00);
        ppaVar22 = this->pScene->mMeshes;
        uVar38 = local_70 & 0xffffffff;
        ppaVar22[uVar38] = this_00;
        puVar4 = pvVar36[uVar38].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar5 = pvVar36[uVar38].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar4 == puVar5) break;
        local_40 = pvVar36 + uVar38;
        this_00->mPrimitiveTypes = 4;
        ppaVar22[uVar38]->mNumVertices = (int)((ulong)((long)puVar5 - (long)puVar4) >> 2) * 3;
        ppaVar22[uVar38]->mNumFaces =
             (uint)((ulong)((long)(local_40->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_40->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
        ppaVar22[uVar38]->mMaterialIndex = (uint)local_70;
        pBVar32 = (this->asBones).
                  super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pBVar39 = (this->asBones).
                  super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar25 = ((long)pBVar39 - (long)pBVar32) / 0x90;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar25;
        uVar26 = SUB168(auVar7 * ZEXT816(0x18),0);
        uVar27 = uVar26 + 8;
        if (0xfffffffffffffff7 < uVar26) {
          uVar27 = 0xffffffffffffffff;
        }
        if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
          uVar27 = 0xffffffffffffffff;
        }
        local_98 = uVar38;
        local_48 = (ulong *)operator_new__(uVar27);
        uVar38 = local_98;
        local_b8 = local_48 + 1;
        *local_48 = uVar25;
        if (pBVar39 != pBVar32) {
          lVar37 = 0;
          do {
            *(undefined8 *)((long)local_48 + lVar37 + 0x18) = 0;
            *(undefined8 *)((long)local_b8 + lVar37) = 0;
            ((undefined8 *)((long)local_b8 + lVar37))[1] = 0;
            lVar37 = lVar37 + 0x18;
          } while (uVar25 * 0x18 - lVar37 != 0);
        }
        uVar20 = 0;
        while( true ) {
          uVar27 = ((long)pBVar39 - (long)pBVar32) / 0x90;
          if (uVar27 <= uVar20) break;
          std::
          vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
          reserve((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   *)(local_b8 + (ulong)uVar20 * 3),ppaVar22[uVar38]->mNumVertices / uVar27);
          uVar20 = uVar20 + 1;
          pBVar32 = (this->asBones).
                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pBVar39 = (this->asBones).
                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar27 = (ulong)ppaVar22[uVar38]->mNumFaces;
        puVar23 = (ulong *)operator_new__(uVar27 * 0x10 + 8);
        paVar1 = (aiFace *)(puVar23 + 1);
        *puVar23 = uVar27;
        if (uVar27 != 0) {
          paVar28 = paVar1;
          do {
            paVar28->mNumIndices = 0;
            paVar28->mIndices = (uint *)0x0;
            paVar28 = paVar28 + 1;
          } while (paVar28 != paVar1 + uVar27);
        }
        ppaVar22[uVar38]->mFaces = paVar1;
        uVar20 = ppaVar22[uVar38]->mNumVertices;
        uVar27 = (ulong)uVar20 * 0xc;
        paVar29 = (aiVector3D *)operator_new__(uVar27);
        if ((ulong)uVar20 != 0) {
          uVar27 = uVar27 - 0xc;
          memset(paVar29,0,(uVar27 - uVar27 % 0xc) + 0xc);
        }
        ppaVar22[uVar38]->mNormals = paVar29;
        uVar20 = ppaVar22[uVar38]->mNumVertices;
        local_c8 = (ulong)uVar20 * 0xc;
        local_60 = paVar29;
        paVar29 = (aiVector3D *)operator_new__(local_c8);
        puVar23 = local_b8;
        if ((ulong)uVar20 != 0) {
          memset(paVar29,0,((local_c8 - 0xc) - (local_c8 - 0xc) % 0xc) + 0xc);
        }
        ppaVar22[uVar38]->mVertices = paVar29;
        local_68 = paVar29;
        if (this->bHasUVs == true) {
          uVar20 = ppaVar22[uVar38]->mNumVertices;
          local_c8 = (ulong)uVar20 * 0xc;
          paVar29 = (aiVector3D *)operator_new__(local_c8);
          if ((ulong)uVar20 != 0) {
            memset(paVar29,0,((local_c8 - 0xc) - (local_c8 - 0xc) % 0xc) + 0xc);
          }
          ppaVar22[uVar38]->mTextureCoords[0] = paVar29;
          ppaVar22[uVar38]->mNumUVComponents[0] = 2;
          local_b0 = paVar29;
        }
        else {
          local_b0 = (aiVector3D *)0x0;
        }
        local_cc = 0;
        uVar27 = 0;
        local_58 = ppaVar22;
        while (uVar27 < ppaVar22[uVar38]->mNumFaces) {
          puVar30 = (uint *)operator_new__(0xc);
          local_a8 = (ulong *)(uVar27 * 0x10);
          ppaVar22[uVar38]->mFaces[uVar27].mIndices = puVar30;
          ppaVar22[uVar38]->mFaces[uVar27].mNumIndices = 3;
          uVar20 = (local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar27];
          pFVar34 = (this->asTriangles).
                    super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_68->z = pFVar34[uVar20].avVertices[0].pos.z;
          fVar11 = pFVar34[uVar20].avVertices[0].pos.y;
          local_68->x = pFVar34[uVar20].avVertices[0].pos.x;
          local_68->y = fVar11;
          local_68[1].z = pFVar34[uVar20].avVertices[1].pos.z;
          fVar11 = pFVar34[uVar20].avVertices[1].pos.y;
          local_68[1].x = pFVar34[uVar20].avVertices[1].pos.x;
          local_68[1].y = fVar11;
          local_68[2].z = pFVar34[uVar20].avVertices[2].pos.z;
          fVar11 = pFVar34[uVar20].avVertices[2].pos.y;
          local_68[2].x = pFVar34[uVar20].avVertices[2].pos.x;
          local_68[2].y = fVar11;
          local_60->z = pFVar34[uVar20].avVertices[0].nor.z;
          fVar11 = pFVar34[uVar20].avVertices[0].nor.y;
          local_60->x = pFVar34[uVar20].avVertices[0].nor.x;
          local_60->y = fVar11;
          fVar11 = pFVar34[uVar20].avVertices[1].nor.y;
          local_60[1].x = pFVar34[uVar20].avVertices[1].nor.x;
          local_60[1].y = fVar11;
          local_60[1].z = pFVar34[uVar20].avVertices[1].nor.z;
          fVar11 = pFVar34[uVar20].avVertices[2].nor.y;
          local_60[2].x = pFVar34[uVar20].avVertices[2].nor.x;
          local_60[2].y = fVar11;
          local_60[2].z = pFVar34[uVar20].avVertices[2].nor.z;
          if (local_b0 == (aiVector3D *)0x0) {
            local_b0 = (aiVector3D *)0x0;
          }
          else {
            local_b0->z = pFVar34[uVar20].avVertices[0].uv.z;
            fVar11 = pFVar34[uVar20].avVertices[0].uv.y;
            local_b0->x = pFVar34[uVar20].avVertices[0].uv.x;
            local_b0->y = fVar11;
            fVar11 = pFVar34[uVar20].avVertices[1].uv.y;
            local_b0[1].x = pFVar34[uVar20].avVertices[1].uv.x;
            local_b0[1].y = fVar11;
            local_b0[1].z = pFVar34[uVar20].avVertices[1].uv.z;
            fVar11 = pFVar34[uVar20].avVertices[2].uv.y;
            local_b0[2].x = pFVar34[uVar20].avVertices[2].uv.x;
            local_b0[2].y = fVar11;
            local_b0[2].z = pFVar34[uVar20].avVertices[2].uv.z;
            local_b0 = local_b0 + 3;
          }
          local_c0 = (aiBone *)pFVar34[uVar20].avVertices;
          local_68 = local_68 + 3;
          local_60 = local_60 + 3;
          local_38 = uVar27;
          for (lVar37 = 0; paVar6 = local_c0, lVar37 != 3; lVar37 = lVar37 + 1) {
            uVar20 = 0;
            local_c8 = local_c8 & 0xffffffff00000000;
            while( true ) {
              ppaVar22 = local_58;
              puVar23 = local_b8;
              uVar38 = (ulong)uVar20;
              lVar40 = *(long *)&(((Vertex *)((long)paVar6 + lVar37 * 0x40))->aiBoneLinks).
                                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data;
              if ((ulong)((long)*(pointer *)
                                 ((long)&(((Vertex *)((long)paVar6 + lVar37 * 0x40))->aiBoneLinks).
                                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                         ._M_impl + 8) - lVar40 >> 3) <= uVar38) break;
              uVar35 = *(uint *)(lVar40 + uVar38 * 8);
              if (((ulong)uVar35 <
                   (ulong)(((long)(this->asBones).
                                  super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->asBones).
                                 super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x90)) &&
                 (uVar35 != ((Vertex *)((long)paVar6 + lVar37 * 0x40))->iParentNode)) {
                local_90._4_4_ = *(float *)(lVar40 + 4 + uVar38 * 8);
                local_90._0_4_ = local_cc;
                std::
                vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                ::emplace_back<std::pair<unsigned_int,float>>
                          ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                            *)(local_b8 + (ulong)uVar35 * 3),(pair<unsigned_int,_float> *)local_90);
                local_c8 = CONCAT44(local_c8._4_4_,
                                    (float)local_c8 + *(float *)(lVar40 + 4 + uVar38 * 8));
              }
              else {
                pLVar24 = DefaultLogger::get();
                Logger::error(pLVar24,
                              "[SMD/VTA] Bone index overflow. The bone index will be ignored, the weight will be assigned to the vertex\' parent node"
                             );
              }
              uVar20 = uVar20 + 1;
            }
            if (((float)local_c8 < 0.975) &&
               (uVar38 = (ulong)((Vertex *)((long)paVar6 + lVar37 * 0x40))->iParentNode,
               uVar38 != 0xffffffff)) {
              if (uVar38 < (ulong)(((long)(this->asBones).
                                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->asBones).
                                         super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x90)) {
                local_90._4_4_ = 1.0 - (float)local_c8;
                local_90._0_4_ = local_cc;
                std::
                vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                ::emplace_back<std::pair<unsigned_int,float>>
                          ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                            *)(local_b8 + uVar38 * 3),(pair<unsigned_int,_float> *)local_90);
              }
              else {
                pLVar24 = DefaultLogger::get();
                Logger::error(pLVar24,
                              "[SMD/VTA] Bone index overflow. The index of the vertex parent bone is invalid. The remaining weights will be normalized to 1.0"
                             );
                if (((float)local_c8 != 0.0) || (NAN((float)local_c8))) {
                  uVar20 = 0;
                  while( true ) {
                    lVar40 = *(long *)&(((Vertex *)((long)paVar6 + lVar37 * 0x40))->aiBoneLinks).
                                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                       ._M_impl.super__Vector_impl_data;
                    if ((ulong)((long)*(pointer *)
                                       ((long)&(((Vertex *)((long)paVar6 + lVar37 * 0x40))->
                                               aiBoneLinks).
                                               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                               ._M_impl + 8) - lVar40 >> 3) <= (ulong)uVar20) break;
                    uVar38 = (ulong)*(uint *)(lVar40 + (ulong)uVar20 * 8);
                    if (uVar38 < (ulong)(((long)(this->asBones).
                                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->asBones).
                                               super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                               ._M_impl.super__Vector_impl_data._M_start) / 0x90)) {
                      *(float *)(puVar23[uVar38 * 3 + 1] - 4) =
                           *(float *)(puVar23[uVar38 * 3 + 1] - 4) * (1.0 / (float)local_c8);
                    }
                    uVar20 = uVar20 + 1;
                  }
                }
              }
            }
            *(value_type_conflict4 *)
             (*(long *)((long)&ppaVar22[local_98]->mFaces->mIndices + (long)local_a8) + lVar37 * 4)
                 = local_cc;
            uVar38 = local_98;
            local_cc = local_cc + 1;
          }
          uVar27 = local_38 + 1;
        }
        local_cc = 0;
        uVar20 = 0;
        for (uVar35 = 0; uVar27 = (ulong)uVar35,
            uVar27 < (ulong)(((long)(this->asBones).
                                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->asBones).
                                   super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x90);
            uVar35 = uVar35 + 1) {
          if (puVar23[uVar27 * 3] != puVar23[uVar27 * 3 + 1]) {
            uVar20 = uVar20 + 1;
            local_cc = uVar20;
          }
        }
        if (uVar20 != 0) {
          ppaVar22[uVar38]->mNumBones = uVar20;
          ppaVar31 = (aiBone **)operator_new__((ulong)ppaVar22[uVar38]->mNumBones << 3);
          ppaVar22[uVar38]->mBones = ppaVar31;
          local_cc = 0;
          for (uVar20 = 0; uVar27 = (ulong)uVar20,
              uVar27 < (ulong)(((long)(this->asBones).
                                      super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->asBones).
                                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x90);
              uVar20 = uVar20 + 1) {
            if (puVar23[uVar27 * 3] != puVar23[uVar27 * 3 + 1]) {
              puVar23 = puVar23 + uVar27 * 3;
              local_c8 = uVar27;
              local_c0 = (aiBone *)operator_new(0x450);
              aiBone::aiBone(local_c0);
              ppaVar31 = ppaVar22[uVar38]->mBones;
              uVar38 = (ulong)local_cc;
              ppaVar31[uVar38] = local_c0;
              local_c0->mNumWeights = (uint)(puVar23[1] - *puVar23 >> 3);
              uVar20 = ppaVar31[uVar38]->mNumWeights;
              local_c0 = (aiBone *)((ulong)uVar20 * 8);
              local_a8 = puVar23;
              __s = (aiVertexWeight *)operator_new__((ulong)local_c0);
              if ((ulong)uVar20 != 0) {
                memset(__s,0,(size_t)local_c0);
              }
              uVar27 = local_c8;
              ppaVar31[uVar38]->mWeights = __s;
              pBVar32 = (this->asBones).
                        super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              paVar6 = ppaVar31[uVar38];
              paVar2 = &pBVar32[local_c8].mOffsetMatrix;
              fVar16 = paVar2->a1;
              fVar17 = paVar2->a2;
              fVar18 = paVar2->a3;
              fVar19 = paVar2->a4;
              pBVar39 = pBVar32 + local_c8;
              fVar14 = (pBVar39->mOffsetMatrix).b1;
              fVar15 = (pBVar39->mOffsetMatrix).b2;
              uVar8 = *(undefined8 *)(&(pBVar39->mOffsetMatrix).b1 + 2);
              pBVar39 = pBVar32 + local_c8;
              fVar12 = (pBVar39->mOffsetMatrix).c1;
              fVar13 = (pBVar39->mOffsetMatrix).c2;
              uVar9 = *(undefined8 *)(&(pBVar39->mOffsetMatrix).c1 + 2);
              pBVar32 = pBVar32 + local_c8;
              fVar11 = (pBVar32->mOffsetMatrix).d2;
              uVar10 = *(undefined8 *)(&(pBVar32->mOffsetMatrix).d1 + 2);
              (paVar6->mOffsetMatrix).d1 = (pBVar32->mOffsetMatrix).d1;
              (paVar6->mOffsetMatrix).d2 = fVar11;
              *(undefined8 *)&(paVar6->mOffsetMatrix).d3 = uVar10;
              (paVar6->mOffsetMatrix).c1 = fVar12;
              (paVar6->mOffsetMatrix).c2 = fVar13;
              *(undefined8 *)&(paVar6->mOffsetMatrix).c3 = uVar9;
              (paVar6->mOffsetMatrix).b1 = fVar14;
              (paVar6->mOffsetMatrix).b2 = fVar15;
              *(undefined8 *)&(paVar6->mOffsetMatrix).b3 = uVar8;
              (paVar6->mOffsetMatrix).a1 = fVar16;
              (paVar6->mOffsetMatrix).a2 = fVar17;
              (paVar6->mOffsetMatrix).a3 = fVar18;
              (paVar6->mOffsetMatrix).a4 = fVar19;
              pBVar32 = (this->asBones).
                        super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              __n = (Vertex *)pBVar32[local_c8].mName._M_string_length;
              if (__n < (Vertex *)0x400) {
                paVar6 = ppaVar31[uVar38];
                (paVar6->mName).length = (ai_uint32)__n;
                local_c0 = (aiBone *)__n;
                memcpy((paVar6->mName).data,pBVar32[local_c8].mName._M_dataplus._M_p,(size_t)__n);
                (paVar6->mName).data[(long)local_c0] = '\0';
                pBVar32 = (this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                ppaVar22 = local_58;
              }
              uVar20 = (uint)local_c8;
              pBVar32[uVar27].bIsUsed = true;
              for (uVar27 = 0; uVar27 < ppaVar31[uVar38]->mNumWeights; uVar27 = uVar27 + 1) {
                ppaVar31[uVar38]->mWeights[uVar27].mVertexId = *(uint *)(*local_a8 + uVar27 * 8);
                ppaVar31[uVar38]->mWeights[uVar27].mWeight = *(float *)(*local_a8 + 4 + uVar27 * 8);
              }
              local_cc = local_cc + 1;
              uVar38 = local_98;
              puVar23 = local_b8;
            }
          }
        }
        puVar23 = local_48;
        lVar40 = *local_48 * 0x18;
        lVar37 = lVar40;
        uVar38 = *local_48;
        while (uVar38 != 0) {
          std::
          _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           *)((long)puVar23 + lVar37 + -0x10));
          lVar37 = lVar37 + -0x18;
          uVar38 = lVar37;
        }
        operator_delete__(puVar23,lVar40 + 8);
        uVar38 = (ulong)((int)local_70 + 1);
      }
      __assert_fail("!aaiFaces[i].empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SMD/SMDLoader.cpp"
                    ,0x10c,"void Assimp::SMDImporter::CreateOutputMeshes()");
    }
    uVar38 = (ulong)pFVar34->iTexture;
    if (uVar38 == 0xffffffff) {
      local_90 = (undefined1  [8])((ulong)local_90 & 0xffffffff00000000);
      pvVar36 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(puVar23 + 0x2fffffffe);
LAB_00527e2d:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (pvVar36,(uint *)local_90);
    }
    else {
      if ((ulong)((long)(this->aszTextures).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->aszTextures).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar38) {
        pLVar24 = DefaultLogger::get();
        Logger::info(pLVar24,"[SMD/VTA] Material index overflow in face");
        local_90._0_4_ =
             (int)((ulong)((long)(this->aszTextures).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->aszTextures).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
        pvVar36 = local_a0 + pFVar34->iTexture;
        goto LAB_00527e2d;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (local_a0 + uVar38,&local_cc);
    }
    pFVar34 = pFVar34 + 1;
    local_cc = local_cc + 1;
  } while( true );
}

Assistant:

void SMDImporter::CreateOutputMeshes() {
    if (aszTextures.empty()) {
        aszTextures.push_back(std::string());
    }

    // we need to sort all faces by their material index
    // in opposition to other loaders we can be sure that each
    // material is at least used once.
    pScene->mNumMeshes = (unsigned int) aszTextures.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    typedef std::vector<unsigned int> FaceList;
    FaceList* aaiFaces = new FaceList[pScene->mNumMeshes];

    // approximate the space that will be required
    unsigned int iNum = (unsigned int)asTriangles.size() / pScene->mNumMeshes;
    iNum += iNum >> 1;
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aaiFaces[i].reserve(iNum);
    }

    // collect all faces
    iNum = 0;
    for (std::vector<SMD::Face>::const_iterator
            iFace =  asTriangles.begin();
            iFace != asTriangles.end();++iFace,++iNum) {
        if (UINT_MAX == (*iFace).iTexture) {
            aaiFaces[(*iFace).iTexture].push_back( 0 );
        } else if ((*iFace).iTexture >= aszTextures.size()) {
            ASSIMP_LOG_INFO("[SMD/VTA] Material index overflow in face");
            aaiFaces[(*iFace).iTexture].push_back((unsigned int)aszTextures.size()-1);
        } else {
            aaiFaces[(*iFace).iTexture].push_back(iNum);
        }
    }

    // now create the output meshes
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aiMesh*& pcMesh = pScene->mMeshes[i] = new aiMesh();
        ai_assert(!aaiFaces[i].empty()); // should not be empty ...

        pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
        pcMesh->mNumVertices = (unsigned int)aaiFaces[i].size()*3;
        pcMesh->mNumFaces = (unsigned int)aaiFaces[i].size();
        pcMesh->mMaterialIndex = i;

        // storage for bones
        typedef std::pair<unsigned int,float> TempWeightListEntry;
        typedef std::vector< TempWeightListEntry > TempBoneWeightList;

        TempBoneWeightList* aaiBones = new TempBoneWeightList[asBones.size()]();

        // try to reserve enough memory without wasting too much
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            aaiBones[iBone].reserve(pcMesh->mNumVertices/asBones.size());
        }

        // allocate storage
        pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];
        aiVector3D* pcNormals = pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcVerts = pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];

        aiVector3D* pcUVs = nullptr;
        if (bHasUVs) {
            pcUVs = pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNumUVComponents[0] = 2;
        }

        iNum = 0;
        for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
            pcMesh->mFaces[iFace].mIndices = new unsigned int[3];
            pcMesh->mFaces[iFace].mNumIndices = 3;

            // fill the vertices
            unsigned int iSrcFace = aaiFaces[i][iFace];
            SMD::Face& face = asTriangles[iSrcFace];

            *pcVerts++ = face.avVertices[0].pos;
            *pcVerts++ = face.avVertices[1].pos;
            *pcVerts++ = face.avVertices[2].pos;

            // fill the normals
            *pcNormals++ = face.avVertices[0].nor;
            *pcNormals++ = face.avVertices[1].nor;
            *pcNormals++ = face.avVertices[2].nor;

            // fill the texture coordinates
            if (pcUVs) {
                *pcUVs++ = face.avVertices[0].uv;
                *pcUVs++ = face.avVertices[1].uv;
                *pcUVs++ = face.avVertices[2].uv;
            }

            for (unsigned int iVert = 0; iVert < 3;++iVert) {
                float fSum = 0.0f;
                for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone)  {
                    TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];

                    // FIX: The second check is here just to make sure we won't
                    // assign more than one weight to a single vertex index
                    if (pairval.first >= asBones.size() || pairval.first == face.avVertices[iVert].iParentNode) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The bone index will be ignored, the weight will be assigned "
                            "to the vertex' parent node");
                        continue;
                    }
                    aaiBones[pairval.first].push_back(TempWeightListEntry(iNum,pairval.second));
                    fSum += pairval.second;
                }
                // ******************************************************************
                // If the sum of all vertex weights is not 1.0 we must assign
                // the rest to the vertex' parent node. Well, at least the doc says
                // we should ...
                // FIX: We use 0.975 as limit, floating-point inaccuracies seem to
                // be very strong in some SMD exporters. Furthermore it is possible
                // that the parent of a vertex is 0xffffffff (if the corresponding
                // entry in the file was unreadable)
                // ******************************************************************
                if (fSum < 0.975f && face.avVertices[iVert].iParentNode != UINT_MAX) {
                    if (face.avVertices[iVert].iParentNode >= asBones.size()) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The index of the vertex parent bone is invalid. "
                            "The remaining weights will be normalized to 1.0");

                        if (fSum) {
                            fSum = 1 / fSum;
                            for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone) {
                                TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];
                                if (pairval.first >= asBones.size()) {
                                    continue;
                                }
                                aaiBones[pairval.first].back().second *= fSum;
                            }
                        }
                    } else {
                        aaiBones[face.avVertices[iVert].iParentNode].push_back(
                            TempWeightListEntry(iNum,1.0f-fSum));
                    }
                }
                pcMesh->mFaces[iFace].mIndices[iVert] = iNum++;
            }
        }

        // now build all bones of the mesh
        iNum = 0;
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            if (!aaiBones[iBone].empty())++iNum;
        }

        if (iNum) {
            pcMesh->mNumBones = iNum;
            pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
            iNum = 0;
            for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
                if (aaiBones[iBone].empty()) {
                    continue;
                }
                aiBone*& bone = pcMesh->mBones[iNum] = new aiBone();

                bone->mNumWeights = (unsigned int)aaiBones[iBone].size();
                bone->mWeights = new aiVertexWeight[bone->mNumWeights];
                bone->mOffsetMatrix = asBones[iBone].mOffsetMatrix;
                bone->mName.Set( asBones[iBone].mName );

                asBones[iBone].bIsUsed = true;

                for (unsigned int iWeight = 0; iWeight < bone->mNumWeights;++iWeight) {
                    bone->mWeights[iWeight].mVertexId = aaiBones[iBone][iWeight].first;
                    bone->mWeights[iWeight].mWeight = aaiBones[iBone][iWeight].second;
                }
                ++iNum;
            }
        }
        delete[] aaiBones;
    }
    delete[] aaiFaces;
}